

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O3

void duckdb::MedianAbsoluteDeviationOperation<double>::
     Window<duckdb::QuantileState<double,duckdb::QuantileStandardType>,double,double>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t ridx)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  undefined8 uVar4;
  CursorType *data;
  idx_t n;
  reference q;
  WindowQuantileState<double> *this_00;
  pointer pWVar5;
  type this_01;
  const_reference pvVar6;
  long lVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  pointer index;
  ulong __new_size;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  QuantileIncluded<double> included;
  MadIndirect mad_indirect;
  MAD mad;
  ID indirect;
  Interpolator<false> interp;
  double local_a0;
  QuantileIncluded<double> local_98;
  QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
  local_88;
  MadAccessor<double,_double,_double> local_78;
  QuantileIndirect<double> local_70;
  Interpolator<false> local_68;
  
  data = QuantileState<double,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
                   ((QuantileState<double,_duckdb::QuantileStandardType> *)l_state,partition);
  local_98.fmask = partition->filter_mask;
  pdVar1 = result->data;
  local_98.dmask = data;
  n = QuantileOperation::FrameSize<double>(&local_98,frames);
  if (n == 0) {
    FlatVector::VerifyFlatVector(result);
    _Var9._M_head_impl = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    if (_Var9._M_head_impl == (unsigned_long *)0x0) {
      local_88.outer =
           (MadAccessor<double,_double,_double> *)
           (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_68,(unsigned_long *)&local_88);
      dVar10 = local_68.RN;
      uVar4 = local_68._0_8_;
      local_68.desc = false;
      local_68._1_7_ = 0;
      local_68.RN = 0.0;
      this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar4;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar10;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.RN !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.RN);
      }
      pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data);
      _Var9._M_head_impl =
           (pTVar8->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           _Var9._M_head_impl;
    }
    bVar3 = (byte)ridx & 0x3f;
    _Var9._M_head_impl[ridx >> 6] =
         _Var9._M_head_impl[ridx >> 6] & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
    return;
  }
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
  q = vector<duckdb::QuantileValue,_true>::operator[]
                ((vector<duckdb::QuantileValue,_true> *)((aggr_input_data->bind_data).ptr + 1),0);
  this_00 = QuantileState<double,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                      ((QuantileState<double,_duckdb::QuantileStandardType> *)l_state);
  if ((g_state != (const_data_ptr_t)0x0) && (*(long *)(g_state + 0x18) != 0)) {
    pWVar5 = unique_ptr<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>,_true>
             ::operator->((unique_ptr<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>,_true>
                           *)(g_state + 0x18));
    if ((QuantileSortTree *)
        (pWVar5->qst).
        super_unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
        .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false> != (QuantileSortTree *)0x0) {
      this_01 = unique_ptr<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>,_true>
                ::operator*((unique_ptr<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>,_true>
                             *)(g_state + 0x18));
      goto LAB_0193096a;
    }
  }
  WindowQuantileState<double>::UpdateSkip(this_00,data,frames,&local_98);
  this_01 = this_00;
LAB_0193096a:
  local_a0 = WindowQuantileState<double>::WindowScalar<double,false>(this_01,data,frames,n,result,q)
  ;
  pvVar6 = vector<duckdb::FrameBounds,_true>::back(frames);
  iVar2 = pvVar6->end;
  pvVar6 = vector<duckdb::FrameBounds,_true>::front(frames);
  __new_size = iVar2 - pvVar6->start;
  this_00->count = __new_size;
  index = (this_00->m).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start;
  if ((ulong)((long)(this_00->m).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)index >> 3) <= __new_size) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this_00->m,__new_size);
    index = (this_00->m).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  }
  ReuseIndexes(index,frames,&this_00->prevs);
  ::std::__partition<unsigned_long*,duckdb::QuantileIncluded<double>>
            (index,index + this_00->count,local_98.fmask,local_98.dmask);
  local_68._0_8_ = local_68._0_8_ & 0xffffffffffffff00;
  lVar7 = n - 1;
  auVar12._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar12._0_8_ = lVar7;
  auVar12._12_4_ = 0x45300000;
  dVar10 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * q->dbl;
  local_68.RN = dVar10;
  dVar11 = floor(dVar10);
  local_68.FRN = (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11;
  dVar10 = ceil(dVar10);
  local_68.CRN = (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f | (long)dVar10;
  local_68.begin = 0;
  local_88.inner = &local_70;
  local_78.median = &local_a0;
  local_88.outer = &local_78;
  local_70.data = data;
  local_68.end = n;
  dVar10 = Interpolator<false>::
           Operation<unsigned_long,double,duckdb::QuantileComposed<duckdb::MadAccessor<double,double,double>,duckdb::QuantileIndirect<double>>>
                     (&local_68,index,result,&local_88);
  *(double *)(pdVar1 + ridx * 8) = dVar10;
  ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::operator=
            (&(this_00->prevs).
              super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>,
             &frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>);
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t ridx) {
		auto &state = *reinterpret_cast<STATE *>(l_state);
		auto gstate = reinterpret_cast<const STATE *>(g_state);

		auto &data = state.GetOrCreateWindowCursor(partition);
		const auto &fmask = partition.filter_mask;

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);

		QuantileIncluded<INPUT_TYPE> included(fmask, data);
		const auto n = FrameSize(included, frames);

		if (!n) {
			auto &rmask = FlatVector::Validity(result);
			rmask.Set(ridx, false);
			return;
		}

		//	Compute the median
		D_ASSERT(aggr_input_data.bind_data);
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();

		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto &quantile = bind_data.quantiles[0];
		auto &window_state = state.GetOrCreateWindowState();
		MEDIAN_TYPE med;
		if (gstate && gstate->HasTree()) {
			med = gstate->GetWindowState().template WindowScalar<MEDIAN_TYPE, false>(data, frames, n, result, quantile);
		} else {
			window_state.UpdateSkip(data, frames, included);
			med = window_state.template WindowScalar<MEDIAN_TYPE, false>(data, frames, n, result, quantile);
		}

		//  Lazily initialise frame state
		window_state.SetCount(frames.back().end - frames.front().start);
		auto index2 = window_state.m.data();
		D_ASSERT(index2);

		// The replacement trick does not work on the second index because if
		// the median has changed, the previous order is not correct.
		// It is probably close, however, and so reuse is helpful.
		auto &prevs = window_state.prevs;
		ReuseIndexes(index2, frames, prevs);
		std::partition(index2, index2 + window_state.count, included);

		Interpolator<false> interp(quantile, n, false);

		// Compute mad from the second index
		using ID = QuantileIndirect<INPUT_TYPE>;
		ID indirect(data);

		using MAD = MadAccessor<INPUT_TYPE, RESULT_TYPE, MEDIAN_TYPE>;
		MAD mad(med);

		using MadIndirect = QuantileComposed<MAD, ID>;
		MadIndirect mad_indirect(mad, indirect);
		rdata[ridx] = interp.template Operation<idx_t, RESULT_TYPE, MadIndirect>(index2, result, mad_indirect);

		//	Prev is used by both skip lists and increments
		prevs = frames;
	}